

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoxObjectiveFunction.cpp
# Opt level: O2

void __thiscall
OpenMD::BoxObjectiveFunction::getGrad
          (BoxObjectiveFunction *this,DynamicVector<double,_std::allocator<double>_> *grad)

{
  pointer pdVar1;
  int j;
  long lVar2;
  double s;
  RealType RVar3;
  Vector<double,_6U> lstress;
  Mat3x3d tao;
  Mat3x3d idm;
  Mat3x3d pressureTensor;
  Vector<double,_6U> local_180;
  SquareMatrix3<double> local_150;
  RectMatrix<double,_3U,_3U> local_108;
  SquareMatrix3<double> local_c0;
  RectMatrix<double,_3U,_3U> local_78;
  
  SquareMatrix<double,_3>::SquareMatrix((SquareMatrix<double,_3> *)&local_78);
  local_c0.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] = 0.0;
  Vector<double,_6U>::Vector(&local_180,(double *)&local_c0);
  SquareMatrix3<double>::inverse(&local_c0,&this->deformation_);
  s = SquareMatrix3<double>::determinant(&this->deformation_);
  Thermo::getPressureTensor((Mat3x3d *)&local_108,&this->thermo);
  RectMatrix<double,_3U,_3U>::operator=(&local_78,&local_108);
  RectMatrix<double,_3U,_3U>::negate(&local_78);
  RectMatrix<double,_3U,_3U>::mul(&local_78,16605.3386);
  operator*(&local_150,(SquareMatrix3<double> *)&local_78,&local_c0);
  operator*((SquareMatrix3<double> *)&local_108,&local_c0,&local_150);
  RectMatrix<double,_3U,_3U>::mul(&local_108,s);
  SquareMatrix3<double>::toVoigtTensor
            ((Vector<double,_6U> *)&local_150,(SquareMatrix3<double> *)&local_108);
  Vector<double,_6U>::operator=(&local_180,(Vector<double,_6U> *)&local_150);
  RVar3 = Thermo::getVolume(&this->thermo);
  pdVar1 = (grad->data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (lVar2 = 0; lVar2 != 6; lVar2 = lVar2 + 1) {
    pdVar1[lVar2] = local_180.data_[lVar2] * RVar3;
  }
  return;
}

Assistant:

void BoxObjectiveFunction::getGrad(DynamicVector<RealType>& grad) {
    Mat3x3d pressureTensor;
    Vector<RealType, 6> lstress(0.0);

    // Find the Lagragian stress tensor, τ, from the physical
    // stress tensor, σ, that was computed from the pressureTensor
    // in this code.
    // τ = det(1+ε) (1+ε)^−1 · σ · (1+ε)^−1
    // (Note that 1+ε is the deformation tensor computed above.)

    Mat3x3d idm  = deformation_.inverse();
    RealType ddm = deformation_.determinant();

    pressureTensor = thermo.getPressureTensor();
    pressureTensor.negate();
    pressureTensor *= Constants::elasticConvert;

    Mat3x3d tao = idm * (pressureTensor * idm);
    tao *= ddm;

    lstress    = tao.toVoigtTensor();
    RealType V = thermo.getVolume();

    for (int j = 0; j < 6; j++) {
      grad[j] = V * lstress[j];
    }
  }